

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

int __thiscall obx::BoxTypeless::remove(BoxTypeless *this,char *__filename)

{
  obx_err err;
  uint64_t result;
  OBX_id_array cIds;
  undefined8 local_28;
  OBX_id_array local_20;
  
  local_28 = 0;
  local_20 = internal::cIdArrayRef
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__filename);
  err = obx_box_remove_many(this->cBox_,&local_20,&local_28);
  internal::checkErrOrThrow(err);
  return (int)local_28;
}

Assistant:

uint64_t BoxTypeless::remove(const std::vector<obx_id>& ids) {
    uint64_t result = 0;
    const OBX_id_array cIds = internal::cIdArrayRef(ids);
    internal::checkErrOrThrow(obx_box_remove_many(cBox_, &cIds, &result));
    return result;
}